

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

void __thiscall glTF::Material::Material(Material *this)

{
  Material *this_local;
  
  glTF::Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00f3de98;
  TexProperty::TexProperty(&this->ambient);
  TexProperty::TexProperty(&this->diffuse);
  TexProperty::TexProperty(&this->specular);
  TexProperty::TexProperty(&this->emission);
  SetDefaults(this);
  return;
}

Assistant:

Material() { SetDefaults(); }